

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

int Helmet_on(void)

{
  schar sVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char cVar6;
  
  if (uarmh != (obj *)0x0) {
    Oprops_on(uarmh,4);
    switch(uarmh->otyp) {
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4e:
    case 0x4f:
    case 0x50:
    case 0x53:
      break;
    case 0x4c:
      cVar6 = -1;
      if (urole.malenum == 0x168) {
        cVar6 = '\x01';
      }
      u.abon.a[5] = u.abon.a[5] + cVar6;
      iflags.botl = '\x01';
      discover_object((int)uarmh->otyp,'\x01','\x01');
      break;
    case 0x51:
      adj_abon(uarmh,uarmh->spe);
      break;
    case 0x52:
      if (u.ualign.type == '\0') {
        iVar3 = rn2(2);
        u.ualign.type = '\x01';
        if (iVar3 != 0) {
          u.ualign.type = -1;
        }
      }
      else {
        u.ualign.type = -u.ualign.type;
      }
      u.ublessed = 0;
    case 0x4d:
      if ((*(uint *)&uarmh->field_0x4a & 1) == 0) {
        if (((u.uprops[0x1e].intrinsic == 0) &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
          pcVar4 = Tobjnam(uarmh,"glow");
          pcVar5 = hcolor("black");
          pline("%s %s for a moment.",pcVar4,pcVar5);
        }
        else {
          pcVar4 = Tobjnam(uarmh,"vibrate");
          pline("%s for a moment.",pcVar4);
        }
        curse(uarmh);
      }
      iflags.botl = '\x01';
      if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
        if (uarmh->otyp == 0x4d) {
          sVar1 = acurr(1);
          pcVar4 = "giddy";
          if ((int)sVar1 <= (int)u.acurr.a[1] + (int)u.abon.a[1] + (int)u.atemp.a[1]) {
            pcVar4 = "like sitting in a corner";
          }
          pline("You feel %s.",pcVar4);
        }
        else {
          pline("Your mind oscillates briefly.");
          discover_object(0x52,'\x01','\x01');
        }
      }
      else {
        pline("My brain hurts!");
      }
      break;
    default:
      warning("Unknown type of %s (%d)","helmet",(ulong)(uint)(int)uarmh->otyp);
    }
    if ((uarmh != (obj *)0x0) && (bVar2 = is_racial_armor(uarmh,&youmonst), bVar2 == '\0')) {
      u.uconduct.unracearmor = u.uconduct.unracearmor + 1;
    }
    if (1 < moves) {
      discover_cursed_equip(uarmh);
    }
  }
  return 0;
}

Assistant:

static int Helmet_on(void)
{
    if (!uarmh) return 0;

    Oprops_on(uarmh, WORN_HELMET);

    switch(uarmh->otyp) {
	case FEDORA:
	case HELMET:
	case DENTED_POT:
	case ELVEN_LEATHER_HELM:
	case DWARVISH_IRON_HELM:
	case ORCISH_HELM:
	case HELM_OF_TELEPATHY:
	case TINFOIL_HAT:
		break;
	case HELM_OF_BRILLIANCE:
		adj_abon(uarmh, uarmh->spe);
		break;
	case CORNUTHAUM:
		/* people think marked wizards know what they're talking
		 * about, but it takes trained arrogance to pull it off,
		 * and the actual enchantment of the hat is irrelevant.
		 */
		ABON(A_CHA) += (Role_if (PM_WIZARD) ? 1 : -1);
		iflags.botl = 1;
		makeknown(uarmh->otyp);
		break;
	case HELM_OF_OPPOSITE_ALIGNMENT:
		if (u.ualign.type == A_NEUTRAL)
		    u.ualign.type = rn2(2) ? A_CHAOTIC : A_LAWFUL;
		else u.ualign.type = -(u.ualign.type);
		u.ublessed = 0; /* lose your god's protection */
	     /* makeknown(uarmh->otyp);   -- moved below, after xname() */
		/*FALLTHRU*/
	case DUNCE_CAP:
		if (!uarmh->cursed) {
		    if (Blind)
			pline("%s for a moment.", Tobjnam(uarmh, "vibrate"));
		    else
			pline("%s %s for a moment.",
			      Tobjnam(uarmh, "glow"), hcolor("black"));
		    curse(uarmh);
		}
		iflags.botl = 1;		/* reveal new alignment or INT & WIS */
		if (Hallucination) {
		    pline("My brain hurts!"); /* Monty Python's Flying Circus */
		} else if (uarmh->otyp == DUNCE_CAP) {
		    pline("You feel %s.",	/* track INT change; ignore WIS */
		  ACURR(A_INT) <= (ABASE(A_INT) + ABON(A_INT) + ATEMP(A_INT)) ?
			     "like sitting in a corner" : "giddy");
		} else {
		    pline("Your mind oscillates briefly.");
		    makeknown(HELM_OF_OPPOSITE_ALIGNMENT);
		}
		break;
	default: warning(unknown_type, c_helmet, uarmh->otyp);
    }

    if (uarmh && !is_racial_armor(uarmh, &youmonst))
	u.uconduct.unracearmor++;

    /* suppress message if called on first game turn via set_wear() */
    if (moves > 1)
	discover_cursed_equip(uarmh);

    return 0;
}